

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O3

UStringTrieResult __thiscall
icu_63::UCharsTrie::branchNext(UCharsTrie *this,UChar *pos,int32_t length,int32_t uchar)

{
  UChar UVar1;
  int iVar2;
  UStringTrieResult UVar3;
  UChar *pUVar4;
  uint uVar5;
  uint uVar6;
  
  if (length == 0) {
    length = (int32_t)(ushort)*pos;
    pos = pos + 1;
  }
  uVar6 = length + 1;
  if (4 < length) {
    do {
      if (uchar < (int)(uint)(ushort)*pos) {
        UVar1 = pos[1];
        uVar5 = (uint)(ushort)UVar1;
        if ((ushort)UVar1 < 0xfc00) {
          pUVar4 = pos + 2;
        }
        else if (UVar1 == L'\xffff') {
          uVar5 = CONCAT22(pos[2],pos[3]);
          pUVar4 = pos + 4;
        }
        else {
          pUVar4 = pos + 3;
          uVar5 = (uint)(ushort)UVar1 * 0x10000 + (uint)(ushort)pos[2] + 0x4000000;
        }
        pos = pUVar4 + (int)uVar5;
        uVar6 = uVar6 >> 1;
      }
      else {
        uVar6 = uVar6 - (uVar6 >> 1);
        if ((ushort)pos[1] < 0xfc00) {
          pos = pos + 2;
        }
        else if (pos[1] == L'\xffff') {
          pos = pos + 4;
        }
        else {
          pos = pos + 3;
        }
      }
    } while (5 < (int)uVar6);
  }
  iVar2 = uVar6 + 1;
  do {
    if ((uint)(ushort)*pos == uchar) {
      pUVar4 = pos + 1;
      UVar1 = *pUVar4;
      uVar6 = (uint)(ushort)UVar1;
      if (UVar1 < L'\0') {
        UVar3 = USTRINGTRIE_FINAL_VALUE;
      }
      else {
        if ((ushort)UVar1 < 0x4000) {
          pUVar4 = pos + 2;
        }
        else if (UVar1 == L'翿') {
          uVar6 = CONCAT22(pos[2],pos[3]);
          pUVar4 = pos + 4;
        }
        else {
          pUVar4 = pos + 3;
          uVar6 = (uint)(ushort)UVar1 * 0x10000 + (uint)(ushort)pos[2] + 0xc0000000;
        }
        pUVar4 = pUVar4 + (int)uVar6;
        UVar3 = USTRINGTRIE_NO_VALUE;
        if (0x3f < (ushort)*pUVar4) {
          UVar3 = (ushort)*pUVar4 >> 0xf ^ USTRINGTRIE_INTERMEDIATE_VALUE;
        }
      }
      this->pos_ = pUVar4;
      return UVar3;
    }
    if ((ushort)(pos[1] & 0x7fffU) < 0x4000) {
      pos = pos + 2;
    }
    else if ((pos[1] & 0x7fffU) == 0x7fff) {
      pos = pos + 4;
    }
    else {
      pos = pos + 3;
    }
    iVar2 = iVar2 + -1;
  } while (2 < iVar2);
  if ((uint)(ushort)*pos == uchar) {
    this->pos_ = pos + 1;
    UVar3 = USTRINGTRIE_NO_VALUE;
    if (0x3f < (ushort)pos[1]) {
      return (ushort)pos[1] >> 0xf ^ USTRINGTRIE_INTERMEDIATE_VALUE;
    }
  }
  else {
    this->pos_ = (char16_t *)0x0;
    UVar3 = USTRINGTRIE_NO_MATCH;
  }
  return UVar3;
}

Assistant:

UStringTrieResult
UCharsTrie::branchNext(const UChar *pos, int32_t length, int32_t uchar) {
    // Branch according to the current unit.
    if(length==0) {
        length=*pos++;
    }
    ++length;
    // The length of the branch is the number of units to select from.
    // The data structure encodes a binary search.
    while(length>kMaxBranchLinearSubNodeLength) {
        if(uchar<*pos++) {
            length>>=1;
            pos=jumpByDelta(pos);
        } else {
            length=length-(length>>1);
            pos=skipDelta(pos);
        }
    }
    // Drop down to linear search for the last few units.
    // length>=2 because the loop body above sees length>kMaxBranchLinearSubNodeLength>=3
    // and divides length by 2.
    do {
        if(uchar==*pos++) {
            UStringTrieResult result;
            int32_t node=*pos;
            if(node&kValueIsFinal) {
                // Leave the final value for getValue() to read.
                result=USTRINGTRIE_FINAL_VALUE;
            } else {
                // Use the non-final value as the jump delta.
                ++pos;
                // int32_t delta=readValue(pos, node);
                int32_t delta;
                if(node<kMinTwoUnitValueLead) {
                    delta=node;
                } else if(node<kThreeUnitValueLead) {
                    delta=((node-kMinTwoUnitValueLead)<<16)|*pos++;
                } else {
                    delta=(pos[0]<<16)|pos[1];
                    pos+=2;
                }
                // end readValue()
                pos+=delta;
                node=*pos;
                result= node>=kMinValueLead ? valueResult(node) : USTRINGTRIE_NO_VALUE;
            }
            pos_=pos;
            return result;
        }
        --length;
        pos=skipValue(pos);
    } while(length>1);
    if(uchar==*pos++) {
        pos_=pos;
        int32_t node=*pos;
        return node>=kMinValueLead ? valueResult(node) : USTRINGTRIE_NO_VALUE;
    } else {
        stop();
        return USTRINGTRIE_NO_MATCH;
    }
}